

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

Error __thiscall
asmjit::ZoneVectorBase::_resize(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  ulong uVar1;
  Error EVar2;
  
  uVar1 = this->_length;
  if (this->_capacity < n) {
    EVar2 = _grow(this,heap,sizeOfT,n - uVar1);
    if (EVar2 != 0) {
      return EVar2;
    }
    if (this->_capacity < n) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/base/zone.cpp"
                 ,0x1ab,"_capacity >= n");
    }
  }
  if (uVar1 <= n && n - uVar1 != 0) {
    memset((void *)(uVar1 * sizeOfT + (long)this->_data),0,(n - uVar1) * sizeOfT);
  }
  this->_length = n;
  return 0;
}

Assistant:

Error ZoneVectorBase::_resize(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t length = _length;
  if (_capacity < n) {
    ASMJIT_PROPAGATE(_grow(heap, sizeOfT, n - length));
    ASMJIT_ASSERT(_capacity >= n);
  }

  if (length < n)
    ::memset(static_cast<uint8_t*>(_data) + length * sizeOfT, 0, (n - length) * sizeOfT);

  _length = n;
  return kErrorOk;
}